

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O3

QDebug print(QDebug debug,SslError error)

{
  undefined8 uVar1;
  SslError in_EDX;
  undefined4 in_register_00000034;
  QChar *pQVar2;
  long in_FS_OFFSET;
  QSslError QStack_48;
  QString local_40;
  long local_28;
  
  pQVar2 = (QChar *)CONCAT44(in_register_00000034,error);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QSslError::QSslError(&QStack_48,in_EDX);
  QSslError::errorString(&local_40,&QStack_48);
  if (local_40.d.ptr == (char16_t *)0x0) {
    local_40.d.ptr = (char16_t *)&QString::_empty;
  }
  QDebug::putString(pQVar2,(ulong)local_40.d.ptr);
  if ((*(QTextStream **)pQVar2)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)pQVar2,' ');
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QSslError::~QSslError(&QStack_48);
  uVar1 = *(undefined8 *)pQVar2;
  *(undefined8 *)pQVar2 = 0;
  *(undefined8 *)debug.stream = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug print(QDebug debug, QSslError::SslError error)
{
    debug << QSslError(error).errorString();
    return debug;
}